

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

wstring_view __thiscall mjs::lexer::get_regex_literal(lexer *this)

{
  size_t sVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  token_type tVar5;
  ulong __pos;
  size_type sVar6;
  runtime_error *prVar7;
  const_reference pvVar8;
  wchar_t *__str;
  int iVar9;
  bool bVar10;
  value_type ch;
  bool in_class;
  bool quote;
  size_t start;
  lexer *this_local;
  wstring_view regex_lit;
  
  if ((int)this->version_ < 1) {
    __assert_fail("version_ >= version::es3 && \"Regular expression literals are not support until ES3\""
                  ,"/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.cpp"
                  ,600,"std::wstring_view mjs::lexer::get_regex_literal()");
  }
  tVar5 = token::type(&this->current_token_);
  bVar10 = true;
  if (tVar5 != divide) {
    tVar5 = token::type(&this->current_token_);
    bVar10 = tVar5 == divideequal;
  }
  if (!bVar10) {
    __assert_fail("current_token_.type() == token_type::divide || current_token_.type() == token_type::divideequal"
                  ,"/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.cpp"
                  ,0x259,"std::wstring_view mjs::lexer::get_regex_literal()");
  }
  sVar1 = this->text_pos_;
  tVar5 = token::type(&this->current_token_);
  iVar9 = 2;
  if (tVar5 == divide) {
    iVar9 = 1;
  }
  __pos = sVar1 - (long)iVar9;
  if (this->text_pos_ <= __pos) {
    __assert_fail("start < text_pos_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.cpp",
                  0x25b,"std::wstring_view mjs::lexer::get_regex_literal()");
  }
  bVar10 = false;
  bVar3 = false;
  do {
    uVar2 = this->text_pos_;
    sVar6 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::size(&this->text_);
    if (sVar6 <= uVar2) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar7,"Unterminated regular expression literal");
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pvVar8 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                       (&this->text_,this->text_pos_);
    iVar9 = *pvVar8;
    bVar4 = anon_unknown_2::is_line_terminator(iVar9,this->version_);
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar7,"Line terminator in regular expression literal");
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (iVar9 == 0x5c) {
      bVar10 = (bool)(bVar10 ^ 1);
    }
    else if (bVar10) {
      bVar10 = false;
    }
    else {
      if (iVar9 == 0x5c) {
        __assert_fail("!quote && ch != \'\\\\\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.cpp"
                      ,0x26c,"std::wstring_view mjs::lexer::get_regex_literal()");
      }
      if (iVar9 == 0x5d) {
        bVar3 = false;
      }
      else if (iVar9 == 0x5b) {
        bVar3 = true;
      }
      else if ((iVar9 == 0x2f) && ((!bVar3 || ((int)this->version_ < 2)))) {
        this->text_pos_ = this->text_pos_ + 1;
        break;
      }
    }
    this->text_pos_ = this->text_pos_ + 1;
  } while( true );
LAB_001d93f9:
  uVar2 = this->text_pos_;
  sVar6 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::size(&this->text_);
  if (sVar6 <= uVar2) {
LAB_001d944e:
    __str = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                      (&this->text_,__pos);
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&this_local,__str,
               this->text_pos_ - __pos);
    next_token(this);
    return _this_local;
  }
  pvVar8 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                     (&this->text_,this->text_pos_);
  bVar10 = anon_unknown_2::is_identifier_part(*pvVar8,this->version_);
  if (!bVar10) goto LAB_001d944e;
  this->text_pos_ = this->text_pos_ + 1;
  goto LAB_001d93f9;
}

Assistant:

std::wstring_view lexer::get_regex_literal() {
    assert(version_ >= version::es3 &&  "Regular expression literals are not support until ES3");
    assert(current_token_.type() == token_type::divide || current_token_.type() == token_type::divideequal);
    const size_t start = text_pos_ - (current_token_.type() == token_type::divide ? 1 : 2);
    assert(start < text_pos_);

    // Body
    for (bool quote = false, in_class = false;; ++text_pos_) {
        if (text_pos_ >= text_.size()) {
            throw std::runtime_error("Unterminated regular expression literal");
        }
        const auto ch = text_[text_pos_];
        if (is_line_terminator(ch, version_)) {
            throw std::runtime_error("Line terminator in regular expression literal");
        } else if (ch == '\\') {
            quote = !quote;
            continue;
        } else if (quote) {
            quote = false;
            continue;
        }
        assert(!quote && ch != '\\');

        if (ch == ']') {
            in_class = false;
        } else if (ch == '[') {
            in_class = true;
        } else if (ch == '/' && (!in_class || version_ < version::es5)) {
            // forward slash can be unquoted in character classes in ES5.1
            ++text_pos_; // The final '/' is part of the regular expression
            break;
        }
    }

    // Flags
    for (; text_pos_ < text_.size(); ++text_pos_) {
        if (!is_identifier_part(text_[text_pos_], version_)) {
            break;
        }
    }

    const std::wstring_view regex_lit{&text_[start], text_pos_ - start};

    next_token();

    return regex_lit;
}